

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

string * __thiscall
flatbuffers::GetAnyValueS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,BaseType type,uint8_t *data,
          Schema *schema,int type_index)

{
  bool bVar1;
  uint16_t field;
  uint uVar2;
  BaseType BVar3;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  return_type this_01;
  String *pSVar4;
  Table *this_02;
  Table *table;
  Type *this_03;
  char *s_00;
  size_t length;
  int64_t t;
  undefined4 in_register_00000014;
  double t_00;
  char *local_110;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string esc;
  string val;
  Field *fielddef;
  VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
  local_78;
  const_iterator it;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *fielddefs;
  Table *table_field;
  Object *objectdef;
  allocator<char> local_39;
  String *local_38;
  String *s;
  Field *pFStack_28;
  int type_index_local;
  Schema *schema_local;
  uint8_t *data_local;
  string *psStack_10;
  BaseType type_local;
  string *s_1;
  
  schema_local = (Schema *)CONCAT44(in_register_00000014,type);
  data_local._4_4_ = (BaseType)this;
  s._4_4_ = (uint)schema;
  pFStack_28 = (Field *)data;
  psStack_10 = __return_storage_ptr__;
  switch(data_local._4_4_) {
  case Float:
  case Double:
    t_00 = GetAnyValueF(data_local._4_4_,(uint8_t *)schema_local);
    NumToString<double>(__return_storage_ptr__,t_00);
    break;
  case String:
    uVar2 = ReadScalar<unsigned_int>(schema_local);
    local_38 = (String *)(schema_local + uVar2);
    if (local_38 == (String *)0x0) {
      local_110 = "";
    }
    else {
      local_110 = String::c_str(local_38);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_110,&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case Vector:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[(elements)]",&local_ea);
    std::allocator<char>::~allocator(&local_ea);
    break;
  case Obj:
    if (data == (uint8_t *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(table)",&local_e9);
      std::allocator<char>::~allocator(&local_e9);
    }
    else {
      this_00 = reflection::Schema::objects((Schema *)data);
      this_01 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(this_00,s._4_4_);
      pSVar4 = reflection::Object::name(this_01);
      String::str_abi_cxx11_(__return_storage_ptr__,pSVar4);
      bVar1 = reflection::Object::is_struct(this_01);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(struct)");
      }
      else {
        uVar2 = ReadScalar<unsigned_int>(schema_local);
        this_02 = &schema_local[uVar2].super_Table;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," { ");
        it.data_ = (uchar *)reflection::Object::fields(this_01);
        Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::begin
                  ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&local_78);
        while( true ) {
          Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::end
                    ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)&fielddef);
          bVar1 = VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                  ::operator!=(&local_78,
                               (VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                                *)&fielddef);
          if (!bVar1) break;
          table = &VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
                   ::operator*(&local_78)->super_Table;
          field = reflection::Field::offset((Field *)table);
          bVar1 = Table::CheckField(this_02,field);
          if (bVar1) {
            GetAnyFieldS_abi_cxx11_
                      ((string *)((long)&esc.field_2 + 8),(flatbuffers *)this_02,table,pFStack_28,
                       schema);
            this_03 = reflection::Field::type((Field *)table);
            BVar3 = reflection::Type::base_type(this_03);
            if (BVar3 == String) {
              std::__cxx11::string::string((string *)local_c8);
              s_00 = (char *)std::__cxx11::string::c_str();
              length = std::__cxx11::string::length();
              schema = (Schema *)0x0;
              EscapeString(s_00,length,(string *)local_c8,true,false);
              std::__cxx11::string::operator=
                        ((string *)(esc.field_2._M_local_buf + 8),(string *)local_c8);
              std::__cxx11::string::~string((string *)local_c8);
            }
            pSVar4 = reflection::Field::name((Field *)table);
            String::str_abi_cxx11_(&local_e8,pSVar4);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)(esc.field_2._M_local_buf + 8));
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
            std::__cxx11::string::~string((string *)(esc.field_2._M_local_buf + 8));
          }
          VectorIterator<flatbuffers::Offset<reflection::Field>,_const_reflection::Field_*,_const_unsigned_char_*,_unsigned_int>
          ::operator++(&local_78);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
      }
    }
    break;
  case Union:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(union)",&local_eb);
    std::allocator<char>::~allocator(&local_eb);
    break;
  default:
    t = GetAnyValueI(data_local._4_4_,(uint8_t *)schema_local);
    NumToString<long>(__return_storage_ptr__,t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetAnyValueS(reflection::BaseType type, const uint8_t *data,
                         const reflection::Schema *schema, int type_index) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: return NumToString(GetAnyValueF(type, data));
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      return s ? s->c_str() : "";
    }
    case reflection::Obj:
      if (schema) {
        // Convert the table to a string. This is mostly for debugging purposes,
        // and does NOT promise to be JSON compliant.
        // Also prefixes the type.
        auto &objectdef = *schema->objects()->Get(type_index);
        auto s = objectdef.name()->str();
        if (objectdef.is_struct()) {
          s += "(struct)";  // TODO: implement this as well.
        } else {
          auto table_field = reinterpret_cast<const Table *>(
              ReadScalar<uoffset_t>(data) + data);
          s += " { ";
          auto fielddefs = objectdef.fields();
          for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
            auto &fielddef = **it;
            if (!table_field->CheckField(fielddef.offset())) continue;
            auto val = GetAnyFieldS(*table_field, fielddef, schema);
            if (fielddef.type()->base_type() == reflection::String) {
              std::string esc;
              flatbuffers::EscapeString(val.c_str(), val.length(), &esc, true,
                                        false);
              val = esc;
            }
            s += fielddef.name()->str();
            s += ": ";
            s += val;
            s += ", ";
          }
          s += "}";
        }
        return s;
      } else {
        return "(table)";
      }
    case reflection::Vector:
      return "[(elements)]";                   // TODO: implement this as well.
    case reflection::Union: return "(union)";  // TODO: implement this as well.
    default: return NumToString(GetAnyValueI(type, data));
  }
}